

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

void __thiscall zmq::msg_t::add_refs(msg_t *this,int refs_)

{
  bool bVar1;
  atomic_counter_t *this_00;
  integer_t in_ESI;
  msg_t *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  msg_t *this_01;
  
  this_01 = in_RDI;
  if ((int)in_ESI < 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","refs_ >= 0",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x24e);
    fflush(_stderr);
    zmq_abort((char *)0x1e880d);
  }
  if ((in_RDI->_u).base.metadata != (metadata_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_u.base.metadata == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x251);
    fflush(_stderr);
    zmq_abort((char *)0x1e886b);
  }
  if ((in_ESI != 0) && (((in_RDI->_u).base.type == 'f' || (bVar1 = is_zcmsg(in_RDI), bVar1)))) {
    if (((in_RDI->_u).base.flags & 0x80) == 0) {
      refcnt(this_01);
      atomic_counter_t::set
                ((atomic_counter_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (integer_t)((ulong)in_RDI >> 0x20));
      (in_RDI->_u).base.flags = (in_RDI->_u).base.flags | 0x80;
    }
    else {
      this_00 = refcnt(this_01);
      atomic_counter_t::add(this_00,in_ESI);
    }
  }
  return;
}

Assistant:

void zmq::msg_t::add_refs (int refs_)
{
    zmq_assert (refs_ >= 0);

    //  Operation not supported for messages with metadata.
    zmq_assert (_u.base.metadata == NULL);

    //  No copies required.
    if (!refs_)
        return;

    //  VSMs, CMSGS and delimiters can be copied straight away. The only
    //  message type that needs special care are long messages.
    if (_u.base.type == type_lmsg || is_zcmsg ()) {
        if (_u.base.flags & msg_t::shared)
            refcnt ()->add (refs_);
        else {
            refcnt ()->set (refs_ + 1);
            _u.base.flags |= msg_t::shared;
        }
    }
}